

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::abort(Forth *this)

{
  allocator<char> local_31;
  string local_30;
  Forth *local_10;
  Forth *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Abort",&local_31);
  throwMessage(this,&local_30,errorAbort);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void abort() {
			throwMessage("Abort",errorAbort);
		}